

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextQueueUndockNode(ImGuiContext *ctx,ImGuiDockNode *node)

{
  int *piVar1;
  ImGuiDockContext *pIVar2;
  ImGuiDockRequest *pIVar3;
  int iVar4;
  ImGuiDockRequest *__dest;
  int iVar5;
  int iVar6;
  uint uStack_3c;
  
  pIVar2 = ctx->DockContext;
  iVar4 = (pIVar2->Requests).Size;
  if (iVar4 == (pIVar2->Requests).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)((long)iVar6 << 6,GImAllocatorUserData);
    pIVar3 = (pIVar2->Requests).Data;
    if (pIVar3 != (ImGuiDockRequest *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar2->Requests).Size << 6);
      pIVar3 = (pIVar2->Requests).Data;
      if ((pIVar3 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar2->Requests).Data = __dest;
    (pIVar2->Requests).Capacity = iVar6;
    iVar4 = (pIVar2->Requests).Size;
  }
  else {
    __dest = (pIVar2->Requests).Data;
  }
  __dest[iVar4].Type = ImGuiDockRequestType_Undock;
  *(ulong *)&__dest[iVar4].field_0x4 = (ulong)uStack_3c;
  *(undefined8 *)(&__dest[iVar4].field_0x4 + 8) = 0;
  __dest[iVar4].DockTargetNode = (ImGuiDockNode *)0x0;
  (&__dest[iVar4].DockTargetNode)[1] = (ImGuiDockNode *)0x0;
  __dest[iVar4].DockSplitDir = -1;
  __dest[iVar4].DockSplitRatio = 0.5;
  __dest[iVar4].DockSplitOuter = false;
  __dest[iVar4].UndockTargetWindow = (ImGuiWindow *)0x0;
  __dest[iVar4].UndockTargetNode = node;
  (pIVar2->Requests).Size = (pIVar2->Requests).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextQueueUndockNode(ImGuiContext* ctx, ImGuiDockNode* node)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetNode = node;
    ctx->DockContext->Requests.push_back(req);
}